

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConn.cpp
# Opt level: O2

void __thiscall TcpConn::OnWrite(TcpConn *this)

{
  BufferChain *pBVar1;
  uint16_t uVar2;
  int __fd;
  char *pcVar3;
  ssize_t sVar4;
  size_t *psVar5;
  ulong uVar6;
  BufferChain *pBVar7;
  
  pBVar7 = (this->super_Buffer).m_writeHead;
  if (pBVar7 == (BufferChain *)0x0) {
    __assert_fail("m_writeHead != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/alphavip[P]pollevent/loop/TcpConn.cpp"
                  ,0x5d,"virtual void TcpConn::OnWrite()");
  }
  psVar5 = &OnWrite::iov[0].iov_len;
  for (uVar6 = 0; (pBVar7 != (BufferChain *)0x0 && (uVar6 < 0x100)); uVar6 = uVar6 + 1) {
    pcVar3 = BufferChain::GetReadAddr(pBVar7);
    ((iovec *)(psVar5 + -1))->iov_base = pcVar3;
    uVar2 = BufferChain::GetCanReadCount(pBVar7);
    *psVar5 = (ulong)uVar2;
    pBVar7 = pBVar7->nextpkt;
    psVar5 = psVar5 + 2;
  }
  __fd = (*(this->super_PollObj)._vptr_PollObj[2])(this);
  sVar4 = writev(__fd,(iovec *)OnWrite::iov,(int)uVar6);
  if (-1 < sVar4) {
    pBVar7 = (this->super_Buffer).m_writeHead;
    while( true ) {
      if ((pBVar7 == (BufferChain *)0x0) || (sVar4 == 0)) goto LAB_00105473;
      uVar2 = BufferChain::GetCanReadCount(pBVar7);
      if (sVar4 < (long)(ulong)uVar2) break;
      uVar2 = BufferChain::GetCanReadCount(pBVar7);
      sVar4 = sVar4 - (ulong)uVar2;
      pBVar1 = pBVar7->nextpkt;
      (this->super_Buffer).m_writeHead = pBVar1;
      (*(this->super_PollObj)._vptr_PollObj[10])(this,pBVar7);
      pBVar7 = pBVar1;
    }
    pBVar7->read = pBVar7->read + (short)sVar4;
LAB_00105473:
    if ((this->super_Buffer).m_writeHead == (BufferChain *)0x0) {
      (this->super_Buffer).m_writeTail = (BufferChain *)0x0;
      Poller::Mod((this->super_PollObj).m_pPoller,&this->super_PollObj,0x11);
      return;
    }
  }
  return;
}

Assistant:

void TcpConn::OnWrite()
{
    assert(m_writeHead != nullptr);

    // 写入网络数据
#define maxionum 256
    static struct iovec iov[maxionum];
    BufferChain* pkt = m_writeHead;
    int iocount = 0;
    while(pkt != NULL)
    {
        if(iocount >= maxionum)
        {
            break;
        }
        iov[iocount].iov_base = pkt->GetReadAddr();
        iov[iocount].iov_len = pkt->GetCanReadCount();
        pkt = pkt->nextpkt;
        iocount++;
    }

    //边缘触发 这里也要改 要在这次里写完
    ssize_t wn = writev(GetSockFd(), iov, iocount);
    if(wn < 0)
    {
        return;
    }

    ssize_t count = wn;
    pkt = m_writeHead;
    while(pkt != NULL)
    {
        if(count == 0)
        {
            break;
        }

        if(count < pkt->GetCanReadCount())
        {
            pkt->read += count;
            count = 0;
            break;
        }
        else
        {
            count -= pkt->GetCanReadCount();
            m_writeHead = pkt->nextpkt;
            BufferChain* cur = pkt;
            pkt = pkt->nextpkt;
            Cycle(cur);
        }
    }


    if(m_writeHead == nullptr)
    {
        m_writeTail = nullptr;
        int32_t ret = m_pPoller->Mod(this, EV_READ|EV_ET);
        if(ret != 0)
        {
            return;
        }
    }
}